

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

ostream * __thiscall
wasm::anon_unknown_0::printMemoryName(anon_unknown_0 *this,Name name,ostream *o,Module *wasm)

{
  ostream *o_00;
  undefined1 local_28 [8];
  Name name_local;
  
  o_00 = name.super_IString.str._M_str;
  name_local.super_IString.str._M_len = name.super_IString.str._M_len;
  if ((o == (ostream *)0x0) || (8 < (ulong)(*(long *)(o + 0x80) - *(long *)(o + 0x78)))) {
    name_local.super_IString.str._M_str._7_1_ = 0x20;
    local_28 = (undefined1  [8])this;
    std::__ostream_insert<char,std::char_traits<char>>
              (o_00,(char *)((long)&name_local.super_IString.str._M_str + 7),1);
    Name::print((Name *)local_28,o_00);
  }
  return o_00;
}

Assistant:

std::ostream& printMemoryName(Name name, std::ostream& o, Module* wasm) {
  if (!wasm || wasm->memories.size() > 1) {
    o << ' ';
    name.print(o);
  }
  return o;
}